

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

int ws_dialer_set_proto(void *arg,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  nni_ws_dialer *d;
  
  iVar1 = 0x1e;
  if (t == NNI_TYPE_STRING) {
    sVar2 = nni_strnlen((char *)buf,sz);
    iVar1 = 3;
    if (sVar2 < sz) {
      pcVar3 = nni_strdup((char *)buf);
      if (pcVar3 == (char *)0x0) {
        iVar1 = 2;
      }
      else {
        nni_mtx_lock((nni_mtx *)((long)arg + 0x58));
        if (*(char **)((long)arg + 0xb8) != (char *)0x0) {
          nni_strfree(*(char **)((long)arg + 0xb8));
        }
        *(char **)((long)arg + 0xb8) = pcVar3;
        nni_mtx_unlock((nni_mtx *)((long)arg + 0x58));
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int
ws_dialer_set_proto(void *arg, const void *buf, size_t sz, nni_type t)
{
	nni_ws_dialer *d = arg;
	int            rv;

	if ((rv = ws_check_string(buf, sz, t)) == 0) {
		char *ns;
		if ((ns = nni_strdup(buf)) == NULL) {
			rv = NNG_ENOMEM;
		} else {
			nni_mtx_lock(&d->mtx);
			if (d->proto != NULL) {
				nni_strfree(d->proto);
			}
			d->proto = ns;
			nni_mtx_unlock(&d->mtx);
		}
	}
	return (rv);
}